

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O1

bool __thiscall GlobOpt::DoCSE(GlobOpt *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JITTimeFunctionBody *pJVar4;
  FunctionJITTimeInfo *pFVar5;
  bool bVar6;
  
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar2 = JITTimeFunctionBody::GetSourceContextId(pJVar4);
  pFVar5 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar3 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar5);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,CSEPhase,uVar2,uVar3);
  bVar6 = false;
  if ((!bVar1) && (this->prePassLoop == (Loop *)0x0)) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar2 = JITTimeFunctionBody::GetSourceContextId(pJVar4);
    pFVar5 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar3 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar5);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,CSEPhase,uVar2,uVar3);
    bVar6 = true;
    if (!bVar1) {
      bVar1 = DoFieldOpts(this,this->currentBlock->loop);
      if ((!bVar1) && ((this->field_0xf7 & 2) == 0)) {
        bVar6 = false;
      }
    }
  }
  return bVar6;
}

Assistant:

bool
GlobOpt::DoCSE()
{
    if (PHASE_OFF(Js::CSEPhase, this->func))
    {
        return false;
    }
    if (this->IsLoopPrePass())
    {
        return false;
    }

    if (PHASE_FORCE(Js::CSEPhase, this->func))
    {
        // Force always turn it on
        return true;
    }

    if (!this->DoFieldOpts(this->currentBlock->loop) && !GetIsAsmJSFunc())
    {
        return false;
    }

    return true;
}